

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
glcts::AtomicCounterLayoutBindingCase::maxBindings(AtomicCounterLayoutBindingCase *this)

{
  Functions *pFVar1;
  GLint local_14;
  AtomicCounterLayoutBindingCase *pAStack_10;
  int units;
  AtomicCounterLayoutBindingCase *this_local;
  
  local_14 = 0;
  pAStack_10 = this;
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->getIntegerv)(0x92dc,&local_14);
  return local_14;
}

Assistant:

int maxBindings()
	{
		int units = 0;
		gl().getIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &units);
		return units;
	}